

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_modifiers.cpp
# Opt level: O0

bool __thiscall ON_Displacement::operator==(ON_Displacement *this,ON_Displacement *dsp)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  SweepResolutionFormulas SVar5;
  SweepResolutionFormulas SVar6;
  double dVar7;
  double dVar8;
  ON_UUID local_40;
  ON_UUID local_30;
  ON_Displacement *local_20;
  ON_Displacement *dsp_local;
  ON_Displacement *this_local;
  
  local_20 = dsp;
  dsp_local = this;
  bVar1 = On(this);
  bVar2 = On(local_20);
  if (bVar1 == bVar2) {
    local_30 = Texture(this);
    local_40 = Texture(local_20);
    bVar1 = ::operator!=(&local_30,&local_40);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      iVar3 = MappingChannel(this);
      iVar4 = MappingChannel(local_20);
      if (iVar3 == iVar4) {
        dVar7 = BlackPoint(this);
        dVar8 = BlackPoint(local_20);
        if ((dVar7 != dVar8) || (NAN(dVar7) || NAN(dVar8))) {
          this_local._7_1_ = false;
        }
        else {
          dVar7 = WhitePoint(this);
          dVar8 = WhitePoint(local_20);
          if ((dVar7 != dVar8) || (NAN(dVar7) || NAN(dVar8))) {
            this_local._7_1_ = false;
          }
          else {
            iVar3 = InitialQuality(this);
            iVar4 = InitialQuality(local_20);
            if (iVar3 == iVar4) {
              bVar1 = FinalMaxFacesOn(this);
              bVar2 = FinalMaxFacesOn(local_20);
              if (bVar1 == bVar2) {
                iVar3 = FinalMaxFaces(this);
                iVar4 = FinalMaxFaces(local_20);
                if (iVar3 == iVar4) {
                  bVar1 = FairingOn(this);
                  bVar2 = FairingOn(local_20);
                  if (bVar1 == bVar2) {
                    iVar3 = Fairing(this);
                    iVar4 = Fairing(local_20);
                    if (iVar3 == iVar4) {
                      dVar7 = PostWeldAngle(this);
                      dVar8 = PostWeldAngle(local_20);
                      if ((dVar7 != dVar8) || (NAN(dVar7) || NAN(dVar8))) {
                        this_local._7_1_ = false;
                      }
                      else {
                        iVar3 = MeshMemoryLimit(this);
                        iVar4 = MeshMemoryLimit(local_20);
                        if (iVar3 == iVar4) {
                          iVar3 = RefineSteps(this);
                          iVar4 = RefineSteps(local_20);
                          if (iVar3 == iVar4) {
                            dVar7 = RefineSensitivity(this);
                            dVar8 = RefineSensitivity(local_20);
                            if ((dVar7 != dVar8) || (NAN(dVar7) || NAN(dVar8))) {
                              this_local._7_1_ = false;
                            }
                            else {
                              SVar5 = SweepResolutionFormula(this);
                              SVar6 = SweepResolutionFormula(local_20);
                              if (SVar5 == SVar6) {
                                this_local._7_1_ = true;
                              }
                              else {
                                this_local._7_1_ = false;
                              }
                            }
                          }
                          else {
                            this_local._7_1_ = false;
                          }
                        }
                        else {
                          this_local._7_1_ = false;
                        }
                      }
                    }
                    else {
                      this_local._7_1_ = false;
                    }
                  }
                  else {
                    this_local._7_1_ = false;
                  }
                }
                else {
                  this_local._7_1_ = false;
                }
              }
              else {
                this_local._7_1_ = false;
              }
            }
            else {
              this_local._7_1_ = false;
            }
          }
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_Displacement::operator == (const ON_Displacement& dsp) const
{
  if (On()                     != dsp.On())                     return false;
  if (Texture()                != dsp.Texture())                return false;
  if (MappingChannel()         != dsp.MappingChannel())         return false;
  if (BlackPoint()             != dsp.BlackPoint())             return false;
  if (WhitePoint()             != dsp.WhitePoint())             return false;
  if (InitialQuality()         != dsp.InitialQuality())         return false;
  if (FinalMaxFacesOn()        != dsp.FinalMaxFacesOn())        return false;
  if (FinalMaxFaces()          != dsp.FinalMaxFaces())          return false;
  if (FairingOn()              != dsp.FairingOn())              return false;
  if (Fairing()                != dsp.Fairing())                return false;
  if (PostWeldAngle()          != dsp.PostWeldAngle())          return false;
  if (MeshMemoryLimit()        != dsp.MeshMemoryLimit())        return false;
  if (RefineSteps()            != dsp.RefineSteps())            return false;
  if (RefineSensitivity()      != dsp.RefineSensitivity())      return false;
  if (SweepResolutionFormula() != dsp.SweepResolutionFormula()) return false;

  return true;
}